

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::emplace<Parser::IncludePath>
          (QGenericArrayOps<Parser::IncludePath> *this,qsizetype i,IncludePath *args)

{
  IncludePath **ppIVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_98;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<Parser::IncludePath>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<Parser::IncludePath>).size == i) {
      qVar4 = QArrayDataPointer<Parser::IncludePath>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<Parser::IncludePath>);
      if (qVar4 == 0) goto LAB_00119d54;
      Parser::IncludePath::IncludePath
                ((this->super_QArrayDataPointer<Parser::IncludePath>).ptr +
                 (this->super_QArrayDataPointer<Parser::IncludePath>).size,args);
LAB_00119e5b:
      pqVar2 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00119e1a;
    }
LAB_00119d54:
    if (i == 0) {
      qVar4 = QArrayDataPointer<Parser::IncludePath>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<Parser::IncludePath>);
      if (qVar4 != 0) {
        Parser::IncludePath::IncludePath
                  ((this->super_QArrayDataPointer<Parser::IncludePath>).ptr + -1,args);
        ppIVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
        *ppIVar1 = *ppIVar1 + -1;
        goto LAB_00119e5b;
      }
    }
  }
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  Parser::IncludePath::IncludePath((IncludePath *)local_48,args);
  bVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).size != 0;
  QArrayDataPointer<Parser::IncludePath>::detachAndGrow
            (&this->super_QArrayDataPointer<Parser::IncludePath>,(uint)(i == 0 && bVar5),1,
             (IncludePath **)0x0,(QArrayDataPointer<Parser::IncludePath> *)0x0);
  if (i == 0 && bVar5) {
    Parser::IncludePath::IncludePath
              ((this->super_QArrayDataPointer<Parser::IncludePath>).ptr + -1,(IncludePath *)local_48
              );
    ppIVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    *ppIVar1 = *ppIVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_98.sourceCopyConstruct = 0;
    local_98.nSource = 0;
    local_98.move = 0;
    local_98.sourceCopyAssign = 0;
    local_98.end = (IncludePath *)0x0;
    local_98.last = (IncludePath *)0x0;
    local_98.where = (IncludePath *)0x0;
    local_98.begin = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    local_98.size = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
    local_98.data = &this->super_QArrayDataPointer<Parser::IncludePath>;
    Inserter::insertOne(&local_98,i,(IncludePath *)local_48);
    (local_98.data)->ptr = local_98.begin;
    (local_98.data)->size = local_98.size;
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_48);
LAB_00119e1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }